

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O3

uchar * Tools::YUV2RGB(uchar *YUVData,uint dataSize)

{
  int iVar1;
  uchar *puVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  puVar2 = (uchar *)operator_new__((ulong)(dataSize * 2));
  uVar12 = (ulong)dataSize;
  uVar11 = uVar12 / 6;
  uVar7 = (ulong)((uint)(uVar12 * 0xaaaaaaab >> 0x20) & 0xfffffffc);
  pvVar3 = operator_new__(uVar7);
  pvVar4 = operator_new__(uVar11);
  pvVar5 = operator_new__(uVar11);
  if (dataSize != 0) {
    iVar1 = (int)uVar11;
    uVar10 = 0;
    do {
      if (uVar10 < uVar7) {
        *(uchar *)((long)pvVar3 + uVar10) = YUVData[uVar10];
      }
      else if (uVar10 < (uint)(iVar1 * 5)) {
        *(uchar *)((long)pvVar4 + (ulong)(uint)(iVar1 * -4 + (int)uVar10)) = YUVData[uVar10];
      }
      else {
        *(uchar *)((long)pvVar5 + (ulong)(uint)(iVar1 * -5 + (int)uVar10)) = YUVData[uVar10];
      }
      uVar10 = uVar10 + 1;
    } while (uVar12 != uVar10);
    if (5 < dataSize) {
      uVar6 = 2;
      uVar7 = 0;
      do {
        dVar13 = (double)(int)(*(byte *)((long)pvVar4 + uVar7) - 0x80);
        dVar14 = (double)(int)(*(byte *)((long)pvVar5 + uVar7) - 0x80);
        lVar8 = 0;
        uVar9 = uVar6;
        do {
          dVar15 = (double)*(byte *)((long)pvVar3 + lVar8);
          puVar2[uVar9 - 2] = (uchar)(int)(dVar13 * 1.772 + dVar15);
          puVar2[uVar9 - 1] = (uchar)(int)(dVar14 * -0.71414 + dVar13 * -0.34414 + dVar15);
          puVar2[uVar9] = (uchar)(int)(dVar14 * 1.402 + dVar15);
          uVar9 = uVar9 + 3;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        uVar7 = uVar7 + 1;
        uVar6 = uVar6 + 0xc;
        pvVar3 = (void *)((long)pvVar3 + 4);
      } while (uVar7 != uVar11);
    }
  }
  return puVar2;
}

Assistant:

uchar * Tools::YUV2RGB(uchar * YUVData, uint dataSize){

	uchar * BGR_Vector = new uchar[dataSize*2];
	uint Y_sum = 4 * (dataSize / 6), U_sum = dataSize / 6, V_sum = dataSize / 6;
	
	uchar * Y_Weight_r = new uchar[Y_sum];
	uchar * U_Weight_r = new uchar[U_sum];
	uchar * V_Weight_r = new uchar[V_sum];
	for(uint i = 0; i < dataSize; i++){
		if(i < Y_sum){
			Y_Weight_r[i] = YUVData[i];
		}else if(i < Y_sum+U_sum){
			U_Weight_r[i-Y_sum] = YUVData[i];
		}else{
			V_Weight_r[i-Y_sum-U_sum] = YUVData[i];
		}
	}


	for(uint i = 0; i < V_sum; i++){
		for(uint j = i * 4; j < i * 4 + 4; j++){

			BGR_Vector[3*j] = uchar(int(Y_Weight_r[j])+ 1.772*(int(U_Weight_r[i])-128));
	
			BGR_Vector[3*j+1] = uchar(int(Y_Weight_r[j])-0.34414*(int(U_Weight_r[i])-128)-0.71414*(int(V_Weight_r[i])-128));

			BGR_Vector[3*j+2] = uchar(int(Y_Weight_r[j])+1.402*(int(V_Weight_r[i])-128));
		}
	}
	return BGR_Vector;
}